

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

int banksia::getNumberOfCores(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (int)lVar1;
}

Assistant:

int getNumberOfCores() {
#ifdef WIN32
		SYSTEM_INFO sysinfo;
		GetSystemInfo(&sysinfo);
		return sysinfo.dwNumberOfProcessors;
#elif MACOS
        int nm[2];
        size_t len = 4;
        uint32_t count;
     
        nm[0] = CTL_HW; nm[1] = HW_AVAILCPU;
        sysctl(nm, 2, &count, &len, NULL, 0);
     
        if(count < 1) {
            nm[1] = HW_NCPU;
            sysctl(nm, 2, &count, &len, NULL, 0);
            if(count < 1) { count = 1; }
            }
        return count;
#else
        return int(sysconf(_SC_NPROCESSORS_ONLN));
#endif
    }